

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxerutil.cc
# Opt level: O0

uint64 mkvmuxer::EbmlElementSize(uint64 type,uint64 value,uint64 fixed_size)

{
  int32 iVar1;
  int32 iVar2;
  undefined8 local_30;
  uint64 ebml_size;
  uint64 fixed_size_local;
  uint64 value_local;
  uint64 type_local;
  
  iVar1 = GetUIntSize(type);
  local_30 = fixed_size;
  if (fixed_size == 0) {
    iVar2 = GetUIntSize(value);
    local_30 = (uint64)iVar2;
  }
  return local_30 + (long)iVar1 + 1;
}

Assistant:

uint64 EbmlElementSize(uint64 type, uint64 value, uint64 fixed_size) {
  // Size of EBML ID
  uint64 ebml_size = GetUIntSize(type);

  // Datasize
  ebml_size += (fixed_size > 0) ? fixed_size : GetUIntSize(value);

  // Size of Datasize
  ebml_size++;

  return ebml_size;
}